

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.cpp
# Opt level: O1

double __thiscall
despot::Function::ComputeConstrainedMinimum(Function *this,NamedVar *var,int value)

{
  uint uVar1;
  uint uVar2;
  invalid_argument *this_00;
  long *plVar3;
  ulong uVar4;
  size_type *psVar5;
  long *plVar6;
  uint uVar7;
  uint index;
  uint uVar8;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double extraout_XMM0_Qa_02;
  vector<int,_std::allocator<int>_> vec;
  int local_e8;
  double local_e0;
  vector<int,_std::allocator<int>_> local_d8;
  long lStack_c0;
  long local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if ((ulong)((long)(var->super_Variable).values_.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(var->super_Variable).values_.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 5) <= (ulong)(long)value) {
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::operator+(&local_70,"Variable ",&var->name_);
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_70);
    local_b0._M_dataplus._M_p = (pointer)*plVar3;
    psVar5 = (size_type *)(plVar3 + 2);
    if ((size_type *)local_b0._M_dataplus._M_p == psVar5) {
      local_b0.field_2._M_allocated_capacity = *psVar5;
      local_b0.field_2._8_8_ = plVar3[3];
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    }
    else {
      local_b0.field_2._M_allocated_capacity = *psVar5;
    }
    local_b0._M_string_length = plVar3[1];
    *plVar3 = (long)psVar5;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    to_string<int>(&local_90,value);
    std::operator+(&local_50,&local_b0,&local_90);
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_50);
    local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)*plVar3;
    plVar6 = plVar3 + 2;
    if ((long *)local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start == plVar6) {
      local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)*plVar6;
      lStack_c0 = plVar3[3];
      local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)&local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage;
    }
    else {
      local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)*plVar6;
    }
    local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
         = (pointer)plVar3[1];
    *plVar3 = (long)plVar6;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    std::invalid_argument::invalid_argument(this_00,(string *)&local_d8);
    __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  uVar1 = (*this->_vptr_Function[7])();
  uVar2 = (*this->_vptr_Function[9])(this);
  local_e0 = INFINITY;
  if (this->child_ == var) {
    if (0 < (int)uVar1) {
      uVar2 = 0;
      do {
        (*this->_vptr_Function[4])(this,(ulong)uVar2,(ulong)(uint)value);
        if (extraout_XMM0_Qa < local_e0) {
          (*this->_vptr_Function[4])(this,(ulong)uVar2,(ulong)(uint)value);
          local_e0 = extraout_XMM0_Qa_00;
        }
        uVar2 = uVar2 + 1;
      } while (uVar1 != uVar2);
    }
  }
  else {
    local_e8 = -1;
    if (0 < (int)uVar1) {
      uVar4 = 0;
      do {
        if ((this->parents_).
            super__Vector_base<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>._M_impl.
            super__Vector_impl_data._M_start[uVar4] == var) {
          local_e8 = (int)uVar4;
          break;
        }
        uVar4 = uVar4 + 1;
      } while (uVar1 != uVar4);
    }
    if (0 < (int)uVar1) {
      local_b8 = (long)local_e8;
      uVar8 = 1;
      if (1 < (int)uVar2) {
        uVar8 = uVar2;
      }
      index = 0;
      do {
        Variable::ComputeIndexVec(&local_d8,&this->parents_,index);
        if (local_e8 == -1) {
          if (0 < (int)uVar2) goto LAB_001471d6;
        }
        else if (local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[local_b8] == value && 0 < (int)uVar2) {
LAB_001471d6:
          uVar4 = 0;
          do {
            (*this->_vptr_Function[4])(this,(ulong)index,uVar4);
            if (extraout_XMM0_Qa_01 < local_e0) {
              (*this->_vptr_Function[4])(this,(ulong)index,uVar4);
              local_e0 = extraout_XMM0_Qa_02;
            }
            uVar7 = (int)uVar4 + 1;
            uVar4 = (ulong)uVar7;
          } while (uVar8 != uVar7);
        }
        if (local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start != (pointer)0x0) {
          operator_delete(local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        index = index + 1;
      } while (index != uVar1);
    }
  }
  return local_e0;
}

Assistant:

double Function::ComputeConstrainedMinimum(const NamedVar* var,
	int value) const {
	if (var->values().size() <= value)
		throw std::invalid_argument(
			"Variable " + var->name() + " cannot have value " + to_string(value)
				+ ".");

	// cout << "Computing constrained minimum (" << var->name() << " = " << value << ")" << endl;
	// cout << *this << endl;
	int parent_size = ParentSize();
	int child_size = ChildSize();
	double min = Globals::POS_INFTY;
	if (var == child_) {
		for (int p = 0; p < parent_size; p++)
			if (GetValue(p, value) < min)
				min = GetValue(p, value);
	} else {
		int id = -1;
		for (int i = 0; i < parent_size; i++)
			if (parents_[i] == var) {
				id = i;
				break;
			}

		for (int p = 0; p < parent_size; p++) {
			vector<int> vec = Variable::ComputeIndexVec(parents_, p);
			if (id == -1 || vec[id] == value) {
				for (int c = 0; c < child_size; c++) {
					if (GetValue(p, c) < min) {
						min = GetValue(p, c);
					}
				}
			}
		}
	}
	// cout << "min = " << min << endl;

	return min;
}